

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int VP8GetInfo(uint8_t *data,size_t data_size,size_t chunk_size,int *width,int *height)

{
  uint3 uVar1;
  uint3 uVar2;
  int iVar3;
  uint *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  uint3 *in_RDI;
  uint *in_R8;
  int h;
  int w;
  int key_frame;
  uint32_t bits;
  int local_4;
  
  if ((in_RDI == (uint3 *)0x0) || (in_RSI < 10)) {
    local_4 = 0;
  }
  else {
    iVar3 = VP8CheckSignature((uint8_t *)((long)in_RDI + 3),in_RSI - 3);
    if (iVar3 == 0) {
      local_4 = 0;
    }
    else {
      uVar1 = *in_RDI;
      uVar2 = in_RDI[2];
      if ((uVar1 & 1) == 0) {
        if ((uVar1 >> 1 & 7) < 4) {
          if ((uVar1 >> 4 & 1) == 0) {
            local_4 = 0;
          }
          else if (uVar1 >> 5 < in_RDX) {
            if (((*(ushort *)((long)in_RDI + 6) & 0x3fff) == 0) || (((ushort)uVar2 & 0x3fff) == 0))
            {
              local_4 = 0;
            }
            else {
              if (in_RCX != (uint *)0x0) {
                *in_RCX = *(ushort *)((long)in_RDI + 6) & 0x3fff;
              }
              if (in_R8 != (uint *)0x0) {
                *in_R8 = (ushort)uVar2 & 0x3fff;
              }
              local_4 = 1;
            }
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int VP8GetInfo(const uint8_t* data, size_t data_size, size_t chunk_size,
               int* const width, int* const height) {
  if (data == NULL || data_size < VP8_FRAME_HEADER_SIZE) {
    return 0;         // not enough data
  }
  // check signature
  if (!VP8CheckSignature(data + 3, data_size - 3)) {
    return 0;         // Wrong signature.
  } else {
    const uint32_t bits = data[0] | (data[1] << 8) | (data[2] << 16);
    const int key_frame = !(bits & 1);
    const int w = ((data[7] << 8) | data[6]) & 0x3fff;
    const int h = ((data[9] << 8) | data[8]) & 0x3fff;

    if (!key_frame) {   // Not a keyframe.
      return 0;
    }

    if (((bits >> 1) & 7) > 3) {
      return 0;         // unknown profile
    }
    if (!((bits >> 4) & 1)) {
      return 0;         // first frame is invisible!
    }
    if (((bits >> 5)) >= chunk_size) {  // partition_length
      return 0;         // inconsistent size information.
    }
    if (w == 0 || h == 0) {
      return 0;         // We don't support both width and height to be zero.
    }

    if (width) {
      *width = w;
    }
    if (height) {
      *height = h;
    }

    return 1;
  }
}